

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::MarkConflicted
          (CWallet *this,uint256 *hashBlock,int conflicting_height,uint256 *hashTx)

{
  long lVar1;
  long in_FS_OFFSET;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  int conflictconfirms;
  int conflicting_height_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  conflicting_height_local = conflicting_height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock25,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x542,false);
  if ((-1 < (this->m_last_block_processed_height | conflicting_height)) &&
     (conflictconfirms = ~this->m_last_block_processed_height + conflicting_height,
     conflictconfirms < 0)) {
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x20);
    *(int **)local_68._M_unused._0_8_ = &conflictconfirms;
    *(CWallet **)((long)local_68._M_unused._0_8_ + 8) = this;
    *(uint256 **)((long)local_68._M_unused._0_8_ + 0x10) = hashBlock;
    *(int **)((long)local_68._M_unused._0_8_ + 0x18) = &conflicting_height_local;
    pcStack_50 = std::
                 _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1359:31)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1359:31)>
               ::_M_manager;
    RecursiveUpdateTxState(this,hashTx,(TryUpdatingStateFn *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock25.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::MarkConflicted(const uint256& hashBlock, int conflicting_height, const uint256& hashTx)
{
    LOCK(cs_wallet);

    // If number of conflict confirms cannot be determined, this means
    // that the block is still unknown or not yet part of the main chain,
    // for example when loading the wallet during a reindex. Do nothing in that
    // case.
    if (m_last_block_processed_height < 0 || conflicting_height < 0) {
        return;
    }
    int conflictconfirms = (m_last_block_processed_height - conflicting_height + 1) * -1;
    if (conflictconfirms >= 0)
        return;

    auto try_updating_state = [&](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
        if (conflictconfirms < GetTxDepthInMainChain(wtx)) {
            // Block is 'more conflicted' than current confirm; update.
            // Mark transaction as conflicted with this block.
            wtx.m_state = TxStateBlockConflicted{hashBlock, conflicting_height};
            return TxUpdate::CHANGED;
        }
        return TxUpdate::UNCHANGED;
    };

    // Iterate over all its outputs, and mark transactions in the wallet that spend them conflicted too.
    RecursiveUpdateTxState(hashTx, try_updating_state);

}